

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O0

bool __thiscall test_CECoordinates::test_Convert2Observed(test_CECoordinates *this)

{
  byte bVar1;
  long *in_RDI;
  CECoordinates *pCVar2;
  CECoordinates *pCVar3;
  CEAngle *pCVar4;
  double yp;
  double jd;
  double longitude;
  double relative_humidity;
  double *hour_angle;
  double *observed_glat;
  CECoordinates *other;
  CECoordinates *this_00;
  CEObserver *observer;
  double *observed_glon;
  CECoordinates obs2obs;
  exception *e;
  CECoordinates obs2obs_1;
  CECoordinates gal2obs;
  CECoordinates icrs2obs;
  CECoordinates cirs2obs;
  CECoordinates testobs;
  double zen;
  double az;
  CECoordinateType *pCVar5;
  CEAngle *pCVar6;
  CEAngle *ycoord;
  CECoordinates *in_stack_fffffffffffff8e0;
  CECoordinates *in_stack_fffffffffffff8f0;
  long *plVar7;
  double in_stack_fffffffffffff8f8;
  allocator *paVar8;
  CECoordinates *in_stack_fffffffffffff900;
  double *in_stack_fffffffffffff908;
  long *wavelength;
  CEObserver *in_stack_fffffffffffff970;
  CEDate *in_stack_fffffffffffff978;
  CEObserver *observer_00;
  CECoordinates *in_stack_fffffffffffff980;
  CEDate *date;
  CEObserver *in_stack_fffffffffffff988;
  double *zen_00;
  CEDate *in_stack_fffffffffffff990;
  allocator *az_00;
  double *in_stack_fffffffffffff998;
  double *in_stack_fffffffffffff9a0;
  double in_stack_fffffffffffff9a8;
  double in_stack_fffffffffffff9b0;
  double *in_stack_fffffffffffff9c0;
  double *in_stack_fffffffffffff9c8;
  double in_stack_fffffffffffff9e8;
  long *dut1;
  double in_stack_fffffffffffff9f0;
  double in_stack_fffffffffffff9f8;
  long *temperature_celsius;
  double in_stack_fffffffffffffa00;
  double in_stack_fffffffffffffa08;
  long *elevation_m;
  double in_stack_fffffffffffffa10;
  CEObserver *this_01;
  double in_stack_fffffffffffffa18;
  double in_stack_fffffffffffffa20;
  CECoordinates *in_stack_fffffffffffffa28;
  double in_stack_fffffffffffffa40;
  long *xp;
  double in_stack_fffffffffffffa48;
  double in_stack_fffffffffffffa50;
  undefined4 local_450;
  allocator local_449;
  string local_448 [32];
  undefined1 local_428 [96];
  undefined4 local_3c8;
  allocator local_3c1;
  string local_3c0 [80];
  undefined4 local_370;
  allocator local_369;
  string local_368 [36];
  undefined4 local_344;
  undefined4 local_31c;
  undefined4 local_318;
  undefined1 local_311 [81];
  undefined4 local_2c0;
  allocator local_2b9;
  string local_2b8 [32];
  undefined1 local_298 [48];
  undefined4 local_268;
  allocator local_261;
  string local_260 [36];
  undefined4 local_23c;
  undefined4 local_214;
  undefined4 local_210;
  allocator local_209;
  string local_208 [80];
  undefined4 local_1b8;
  allocator local_1b1;
  string local_1b0 [32];
  undefined1 local_190 [48];
  undefined4 local_160;
  allocator local_159;
  string local_158 [36];
  undefined4 local_134;
  undefined4 local_10c;
  undefined4 local_108;
  allocator local_101;
  string local_100 [80];
  undefined4 local_b0;
  allocator local_a9;
  string local_a8 [48];
  undefined1 local_78 [48];
  undefined1 local_48 [48];
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = 0;
  CECoordinates::CECoordinates(in_stack_fffffffffffff8f0);
  CEDate::operator_cast_to_double((CEDate *)0x123339);
  CEObserver::Longitude_Rad((CEObserver *)(in_RDI + 100));
  CEObserver::Latitude_Rad((CEObserver *)(in_RDI + 100));
  CEObserver::Elevation_m((CEObserver *)(in_RDI + 100));
  CEObserver::Pressure_hPa((CEObserver *)(in_RDI + 100));
  CEObserver::Temperature_C((CEObserver *)(in_RDI + 100));
  CEObserver::RelativeHumidity((CEObserver *)(in_RDI + 100));
  CEDate::dut1((CEDate *)0x123412);
  pCVar2 = (CECoordinates *)CEDate::xpolar((CEDate *)0x123431);
  pCVar3 = (CECoordinates *)CEDate::ypolar((CEDate *)0x123450);
  pCVar4 = (CEAngle *)CEObserver::Wavelength_um((CEObserver *)(in_RDI + 100));
  CECoordinates::ConvertToObserved
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
             in_stack_fffffffffffffa40,in_stack_fffffffffffffa48,in_stack_fffffffffffffa50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"test_Convert2Observed",&local_a9);
  local_b0 = 0x19d;
  (**(code **)(*in_RDI + 200))(in_RDI,local_78,in_RDI + 0x56,local_a8,&local_b0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  CECoordinates::GetObservedCoords
            (in_stack_fffffffffffff980,in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  CECoordinates::operator=(pCVar3,pCVar2);
  CECoordinates::~CECoordinates(pCVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"test_Convert2Observed",&local_101);
  local_108 = 0x1a0;
  (**(code **)(*in_RDI + 200))(in_RDI,local_78,in_RDI + 0x56,local_100,&local_108);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  CppEphem::julian_date_J2000();
  CECoordinates::XCoordinate_Deg(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  CppEphem::julian_date_J2000();
  CECoordinates::YCoordinate_Deg(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  local_10c = 0;
  CEObserver::Wavelength_um((CEObserver *)(in_RDI + 100));
  pCVar6 = (CEAngle *)0x0;
  pCVar5 = (CECoordinateType *)0x0;
  CECoordinates::CIRS2Observed
            (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
             (CEAngleType *)in_stack_fffffffffffff980,(double)in_stack_fffffffffffff978,
             (double *)in_stack_fffffffffffff970,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9c8
            );
  CEAngle::Deg(in_stack_fffffffffffff908);
  CEAngle::Deg(in_stack_fffffffffffff908);
  local_134 = 3;
  CECoordinates::SetCoordinates(in_stack_fffffffffffff8e0,pCVar4,pCVar6,pCVar5);
  CEAngle::~CEAngle((CEAngle *)0x123848);
  CEAngle::~CEAngle((CEAngle *)0x123855);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"test_Convert2Observed",&local_159);
  local_160 = 0x1aa;
  (**(code **)(*in_RDI + 200))(in_RDI,local_48,in_RDI + 0x56,local_158,&local_160);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  CEDate::operator_cast_to_double((CEDate *)0x12391e);
  CEObserver::Longitude_Rad((CEObserver *)(in_RDI + 100));
  CEObserver::Latitude_Rad((CEObserver *)(in_RDI + 100));
  CEObserver::Elevation_m((CEObserver *)(in_RDI + 100));
  CEObserver::Pressure_hPa((CEObserver *)(in_RDI + 100));
  CEObserver::Temperature_C((CEObserver *)(in_RDI + 100));
  CEObserver::RelativeHumidity((CEObserver *)(in_RDI + 100));
  CEDate::dut1((CEDate *)0x1239f7);
  pCVar2 = (CECoordinates *)CEDate::xpolar((CEDate *)0x123a16);
  pCVar3 = (CECoordinates *)CEDate::ypolar((CEDate *)0x123a35);
  pCVar4 = (CEAngle *)CEObserver::Wavelength_um((CEObserver *)(in_RDI + 100));
  CECoordinates::ConvertToObserved
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
             in_stack_fffffffffffffa40,in_stack_fffffffffffffa48,in_stack_fffffffffffffa50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"test_Convert2Observed",&local_1b1);
  local_1b8 = 0x1b9;
  (**(code **)(*in_RDI + 200))(in_RDI,local_190,in_RDI + 0x56,local_1b0,&local_1b8);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  CECoordinates::GetObservedCoords
            (in_stack_fffffffffffff980,in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  CECoordinates::operator=(pCVar3,pCVar2);
  CECoordinates::~CECoordinates(pCVar3);
  plVar7 = in_RDI + 0x56;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"test_Convert2Observed",&local_209);
  local_210 = 0x1bc;
  (**(code **)(*in_RDI + 200))(in_RDI,local_190,plVar7,local_208,&local_210);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  xp = in_RDI + 0x4a;
  yp = CppEphem::julian_date_J2000();
  CECoordinates::XCoordinate_Deg(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  pCVar3 = (CECoordinates *)(in_RDI + 0x4a);
  CppEphem::julian_date_J2000();
  jd = CECoordinates::YCoordinate_Deg(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  elevation_m = in_RDI + 0x5c;
  this_01 = (CEObserver *)(in_RDI + 100);
  local_214 = 0;
  longitude = CEObserver::Wavelength_um(this_01);
  pCVar6 = (CEAngle *)0x0;
  pCVar5 = (CECoordinateType *)0x0;
  CECoordinates::ICRS2Observed
            (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
             (CEAngleType *)in_stack_fffffffffffff980,(double)in_stack_fffffffffffff978,
             (double *)in_stack_fffffffffffff970,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9c8
            );
  CEAngle::Deg(in_stack_fffffffffffff908);
  CEAngle::Deg(in_stack_fffffffffffff908);
  local_23c = 3;
  CECoordinates::SetCoordinates(in_stack_fffffffffffff8e0,pCVar4,pCVar6,pCVar5);
  CEAngle::~CEAngle((CEAngle *)0x123e2d);
  CEAngle::~CEAngle((CEAngle *)0x123e3a);
  temperature_celsius = in_RDI + 0x56;
  paVar8 = &local_261;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"test_Convert2Observed",paVar8);
  local_268 = 0x1c6;
  (**(code **)(*in_RDI + 200))(in_RDI,local_48,temperature_celsius,local_260,&local_268);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  dut1 = in_RDI + 0x50;
  relative_humidity = CEDate::operator_cast_to_double((CEDate *)0x123f03);
  CEObserver::Longitude_Rad((CEObserver *)(in_RDI + 100));
  CEObserver::Latitude_Rad((CEObserver *)(in_RDI + 100));
  CEObserver::Elevation_m((CEObserver *)(in_RDI + 100));
  CEObserver::Pressure_hPa((CEObserver *)(in_RDI + 100));
  CEObserver::Temperature_C((CEObserver *)(in_RDI + 100));
  hour_angle = (double *)CEObserver::RelativeHumidity((CEObserver *)(in_RDI + 100));
  observed_glat = (double *)CEDate::dut1((CEDate *)0x123fdc);
  other = (CECoordinates *)CEDate::xpolar((CEDate *)0x123ffb);
  this_00 = (CECoordinates *)CEDate::ypolar((CEDate *)0x12401a);
  pCVar6 = (CEAngle *)CEObserver::Wavelength_um((CEObserver *)(in_RDI + 100));
  pCVar4 = pCVar6;
  pCVar2 = this_00;
  CECoordinates::ConvertToObserved
            (pCVar3,jd,longitude,(double)this_01,(double)elevation_m,(double)paVar8,
             (double)temperature_celsius,relative_humidity,(double)dut1,(double)xp,yp,(double)plVar7
            );
  zen_00 = (double *)(in_RDI + 0x56);
  az_00 = &local_2b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"test_Convert2Observed",az_00);
  local_2c0 = 0x1d5;
  (**(code **)(*in_RDI + 200))(in_RDI,local_298,zen_00,local_2b8,&local_2c0);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  CECoordinates::GetObservedCoords
            (in_stack_fffffffffffff980,in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  CECoordinates::operator=(this_00,other);
  CECoordinates::~CECoordinates(this_00);
  observer_00 = (CEObserver *)(in_RDI + 0x56);
  date = (CEDate *)local_311;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_311 + 1),"test_Convert2Observed",(allocator *)date);
  local_318 = 0x1d8;
  (**(code **)(*in_RDI + 200))(in_RDI,local_298,observer_00,local_311 + 1,&local_318);
  std::__cxx11::string::~string((string *)(local_311 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_311);
  wavelength = in_RDI + 0x50;
  observer = (CEObserver *)CppEphem::julian_date_J2000();
  observed_glon =
       (double *)CECoordinates::XCoordinate_Deg(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8)
  ;
  CppEphem::julian_date_J2000();
  CECoordinates::YCoordinate_Deg(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  local_31c = 0;
  CEObserver::Wavelength_um((CEObserver *)(in_RDI + 100));
  ycoord = (CEAngle *)0x0;
  pCVar5 = (CECoordinateType *)0x0;
  CECoordinates::Galactic2Observed
            ((double)pCVar2,(double)pCVar4,(double *)az_00,zen_00,date,observer_00,
             (CEAngleType *)observer,(double)wavelength,observed_glon,observed_glat,hour_angle);
  CEAngle::Deg(in_stack_fffffffffffff908);
  CEAngle::Deg(in_stack_fffffffffffff908);
  local_344 = 3;
  CECoordinates::SetCoordinates(in_stack_fffffffffffff8e0,pCVar6,ycoord,pCVar5);
  CEAngle::~CEAngle((CEAngle *)0x124400);
  CEAngle::~CEAngle((CEAngle *)0x12440d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"test_Convert2Observed",&local_369);
  local_370 = 0x1e2;
  (**(code **)(*in_RDI + 200))(in_RDI,local_48,in_RDI + 0x56,local_368,&local_370);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  CEDate::CurrentJD();
  pCVar2 = (CECoordinates *)0x0;
  CECoordinates::ConvertToObserved
            (pCVar3,jd,longitude,(double)this_01,(double)elevation_m,(double)paVar8,
             (double)temperature_celsius,relative_humidity,(double)dut1,(double)xp,yp,(double)plVar7
            );
  paVar8 = &local_3c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"test_Convert2Observed",paVar8);
  local_3c8 = 0x1e7;
  (**(code **)(*in_RDI + 0x48))(in_RDI,0,local_3c0,&local_3c8);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  CECoordinates::~CECoordinates(pCVar2);
  CECoordinates::GetObservedCoords((CECoordinates *)date,(CEDate *)observer_00,observer);
  plVar7 = in_RDI + 0x56;
  paVar8 = &local_449;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"test_Convert2Observed",paVar8);
  local_450 = 0x1ed;
  (**(code **)(*in_RDI + 200))(in_RDI,local_428,plVar7,local_448,&local_450);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  CECoordinates::~CECoordinates(pCVar2);
  CECoordinates::~CECoordinates(pCVar2);
  CECoordinates::~CECoordinates(pCVar2);
  CECoordinates::~CECoordinates(pCVar2);
  CECoordinates::~CECoordinates(pCVar2);
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CECoordinates::test_Convert2Observed()
{
    // preliminary variables for observer based conversion
    double az(0.0);
    double zen(0.0);
    CECoordinates testobs;

    // CIRS -> Observed
    CECoordinates cirs2obs = base_cirs_.ConvertToObserved(
                                base_date_,     // date
                                base_observer_.Longitude_Rad(),
                                base_observer_.Latitude_Rad(),
                                base_observer_.Elevation_m(),
                                base_observer_.Pressure_hPa(),
                                base_observer_.Temperature_C(),
                                base_observer_.RelativeHumidity(),
                                base_date_.dut1(),
                                base_date_.xpolar(),
                                base_date_.ypolar(),
                                base_observer_.Wavelength_um());
    test_coords(cirs2obs, base_obs_, __func__, __LINE__);
    // 'GetObservedCoords' method
    cirs2obs = base_cirs_.GetObservedCoords(base_date_, base_observer_);
    test_coords(cirs2obs, base_obs_, __func__, __LINE__);
    // Test the 'CEObserver' based approach
    CECoordinates::CIRS2Observed(base_cirs_.XCoordinate_Deg(),
                                 base_cirs_.YCoordinate_Deg(),
                                 &az, &zen,
                                 base_date_, base_observer_, 
                                 CEAngleType::DEGREES,
                                 base_observer_.Wavelength_um());
    testobs.SetCoordinates(CEAngle::Deg(az), CEAngle::Deg(zen), 
                           CECoordinateType::OBSERVED);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // ICRS -> Observed
    CECoordinates icrs2obs = base_icrs_.ConvertToObserved(
                                base_date_,     // date
                                base_observer_.Longitude_Rad(),
                                base_observer_.Latitude_Rad(),
                                base_observer_.Elevation_m(),
                                base_observer_.Pressure_hPa(),
                                base_observer_.Temperature_C(),
                                base_observer_.RelativeHumidity(),
                                base_date_.dut1(),
                                base_date_.xpolar(),
                                base_date_.ypolar(),
                                base_observer_.Wavelength_um());
    test_coords(icrs2obs, base_obs_, __func__, __LINE__);
    // 'GetObservedCoords' method
    icrs2obs = base_icrs_.GetObservedCoords(base_date_, base_observer_);
    test_coords(icrs2obs, base_obs_, __func__, __LINE__);
    // Test the 'CEObserver' based approach
    CECoordinates::ICRS2Observed(base_icrs_.XCoordinate_Deg(),
                                 base_icrs_.YCoordinate_Deg(),
                                 &az, &zen,
                                 base_date_, base_observer_, 
                                 CEAngleType::DEGREES,
                                 base_observer_.Wavelength_um());
    testobs.SetCoordinates(CEAngle::Deg(az), CEAngle::Deg(zen), 
                           CECoordinateType::OBSERVED);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // Galactic -> Observed
    CECoordinates gal2obs = base_gal_.ConvertToObserved(
                                base_date_,     // date
                                base_observer_.Longitude_Rad(),
                                base_observer_.Latitude_Rad(),
                                base_observer_.Elevation_m(),
                                base_observer_.Pressure_hPa(),
                                base_observer_.Temperature_C(),
                                base_observer_.RelativeHumidity(),
                                base_date_.dut1(),
                                base_date_.xpolar(),
                                base_date_.ypolar(),
                                base_observer_.Wavelength_um());
    test_coords(gal2obs, base_obs_, __func__, __LINE__);
    // 'GetObservedCoords' method
    gal2obs = base_gal_.GetObservedCoords(base_date_, base_observer_);
    test_coords(gal2obs, base_obs_, __func__, __LINE__);
    // Test the 'CEObserver' based approach
    CECoordinates::Galactic2Observed(base_gal_.XCoordinate_Deg(),
                                     base_gal_.YCoordinate_Deg(),
                                     &az, &zen,
                                     base_date_, base_observer_, 
                                     CEAngleType::DEGREES,
                                     base_observer_.Wavelength_um());
    testobs.SetCoordinates(CEAngle::Deg(az), CEAngle::Deg(zen), 
                           CECoordinateType::OBSERVED);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // Observed -> Observed
    try {
        CECoordinates obs2obs = base_obs_.ConvertToObserved();
        test(false, __func__, __LINE__);
    } catch (std::exception &e) {
        test(true, __func__, __LINE__);
    }
    // 'GetObservedCoords' method
    CECoordinates obs2obs = base_obs_.GetObservedCoords(base_date_, base_observer_);
    test_coords(obs2obs, base_obs_, __func__, __LINE__);

    return pass();
}